

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

int Fl_X::xrender_supported(void)

{
  int nop2;
  int nop1;
  undefined1 auStack_8 [4];
  undefined1 local_4 [4];
  
  if (xrender_supported::result == -1) {
    fl_open_display();
    xrender_supported::result = XRenderQueryExtension(fl_display,local_4,auStack_8);
  }
  return xrender_supported::result;
}

Assistant:

int Fl_X::xrender_supported() {
#if HAVE_XRENDER
  static int result = -1;

  if (result == -1) {
    fl_open_display();

    int nop1, nop2;
    result = XRenderQueryExtension(fl_display, &nop1, &nop2);
  }

  return result;
#else
  return 0;
#endif
}